

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O1

void __thiscall FBackdropTexture::FBackdropTexture(FBackdropTexture *this)

{
  double dVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FTexture_006f2b68;
  (this->super_FTexture).Width = 0x90;
  (this->super_FTexture).Height = 0xa0;
  (this->super_FTexture).WidthBits = '\b';
  (this->super_FTexture).HeightBits = '\b';
  (this->super_FTexture).WidthMask = 0xff;
  this->LastRenderTic = 0;
  do {
    dVar1 = cos((double)(int)lVar2 * 0.02454369260617026);
    *(int *)(&(this->super_FTexture).field_0x54 + lVar2 * 4) = (int)(long)(dVar1 * 65536.0);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  this->time1 = 0x80000000;
  this->time2 = 0x27d27d27;
  this->time3 = 0x46666666;
  this->time4 = 0xb60b60;
  this->t1ang = 0x40000000;
  this->t2ang = 0;
  this->z1ang = 0;
  this->z2ang = 0x20000000;
  return;
}

Assistant:

FBackdropTexture::FBackdropTexture()
{
	Width = 144;
	Height = 160;
	WidthBits = 8;
	HeightBits = 8;
	WidthMask = 255;
	LastRenderTic = 0;

	for (int i = 0; i < COS_SIZE; ++i)
	{
		costab[i] = uint32_t(cos(i * (M_PI / (COS_SIZE / 2))) * 65536);
	}

	time1 = DEGREES(180);
	time2 = DEGREES(56);
	time3 = DEGREES(99);
	time4 = DEGREES(1);
	t1ang = DEGREES(90);
	t2ang = 0;
	z1ang = 0;
	z2ang = DEGREES(45);
}